

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haxx_unary_op.cxx
# Opt level: O2

void __thiscall HAXX_UNARY_OP::complex_unary_sub::test_method(complex_unary_sub *this)

{
  undefined8 local_120;
  undefined8 local_118;
  undefined **local_110;
  undefined1 local_108;
  undefined8 *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_38 = "";
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x86);
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_00150bc8;
  local_120 = 0x40170a3d70a3d70a;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_58 = "";
  local_118 = 0x40170a3d70a3d70a;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (&local_110,&local_60,0x86,1,2,&local_120,"q.real()",&local_118,"1. - x.real()");
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x87);
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_00150bc8;
  local_120 = 0xc00ccccccccccccc;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_88 = "";
  local_118 = 0xc00ccccccccccccc;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (&local_110,&local_90,0x87,1,2,&local_120,"q.imag_i()",&local_118,"2. - x.imag()");
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = "";
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x88);
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_00150bc8;
  local_118 = 0x4008000000000000;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_b8 = "";
  local_120 = 0x4008000000000000;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (&local_110,&local_c0,0x88,1,2,&local_120,"q.imag_j()",&local_118,"3.");
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x89);
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_00150bc8;
  local_120 = 0x4010000000000000;
  local_118 = 0x4010000000000000;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_e8 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (&local_110,&local_f0,0x89,1,2,&local_120,"q.imag_k()",&local_118,"4.");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(complex_unary_sub)
{

  HAXX::quaternion<double> q(1.,2.,3.,4.);
  std::complex<double> x(-4.76,5.6);
  q -= x;

  // Check that q is unchanged
  BOOST_CHECK_EQUAL(q.real(),1. - x.real());
  BOOST_CHECK_EQUAL(q.imag_i(),2. - x.imag());
  BOOST_CHECK_EQUAL(q.imag_j(),3.);
  BOOST_CHECK_EQUAL(q.imag_k(),4.);

}